

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

complex<float> re::fft::flip<(re::fft::direction)0,float>(complex<float> value)

{
  complex<float> cVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  float __r;
  float fVar2;
  complex<float> local_10;
  complex<float> local_8;
  
  __r = std::complex<float>::imag_abi_cxx11_(&local_10);
  fVar2 = std::complex<float>::real_abi_cxx11_(&local_10);
  std::complex<float>::complex(&local_8,__r,-fVar2);
  cVar1._M_value._1_7_ = extraout_var;
  cVar1._M_value._0_1_ = extraout_AL;
  return (complex<float>)cVar1._M_value;
}

Assistant:

constexpr std::complex<T> flip(std::complex<T> value)
noexcept {
    return Direction == direction::forward
           ? std::complex<T>{  value.imag(), -value.real() }
           : std::complex<T>{ -value.imag(),  value.real() };
}